

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O0

char16_t * PAL_wcsncat(char16_t *strDest,char16_t *strSource,size_t count)

{
  size_t sVar1;
  uint local_34;
  UINT StrSourceLength;
  UINT LoopCount;
  char16_t *start;
  size_t count_local;
  char16_t *strSource_local;
  char16_t *strDest_local;
  
  local_34 = 0;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (strDest == (char16_t *)0x0) {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    strDest_local = (char16_t *)0x0;
  }
  else {
    strSource_local = strDest;
    if (strSource == (char16_t *)0x0) {
      if (!PAL_InitializeChakraCoreCalled) {
        abort();
      }
      if (!PAL_InitializeChakraCoreCalled) {
        abort();
      }
      strDest_local = (char16_t *)0x0;
    }
    else {
      for (; *strSource_local != L'\0'; strSource_local = strSource_local + 1) {
      }
      sVar1 = PAL_wcslen(strSource);
      count_local = (size_t)strSource;
      start = (char16_t *)count;
      if ((sVar1 & 0xffffffff) < count) {
        start = (char16_t *)(sVar1 & 0xffffffff);
      }
      for (; *(short *)count_local != 0 && (char16_t *)(ulong)local_34 < start;
          local_34 = local_34 + 1) {
        *strSource_local = *(char16_t *)count_local;
        count_local = count_local + 2;
        strSource_local = strSource_local + 1;
      }
      *strSource_local = L'\0';
      strDest_local = strDest;
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
    }
  }
  return strDest_local;
}

Assistant:

char16_t *
__cdecl
PAL_wcsncat( char16_t * strDest, const char16_t *strSource, size_t count )
{
    char16_t *start = strDest;
    UINT LoopCount = 0;
    UINT StrSourceLength = 0;

    PERF_ENTRY(wcsncat);
    ENTRY( "wcsncat (strDestination=%p (%S), strSource=%p (%S), count=%lu )\n",
            strDest ? strDest : W16_NULLSTRING,
            strDest ? strDest : W16_NULLSTRING,
            strSource ? strSource : W16_NULLSTRING,
            strSource ? strSource : W16_NULLSTRING, (unsigned long) count);

    if ( strDest == NULL )
    {
        ERROR("invalid strDest argument\n");
        LOGEXIT("wcsncat returning char16_t NULL\n");
        PERF_EXIT(wcsncat);
        return NULL;
    }

    if ( strSource == NULL )
    {
        ERROR("invalid strSource argument\n");
        LOGEXIT("wcsncat returning char16_t NULL\n");
        PERF_EXIT(wcsncat);
        return NULL;
    }

    /* find end of source string */
    while ( *strDest )
    {
        strDest++;
    }

    StrSourceLength = PAL_wcslen( strSource );
    if ( StrSourceLength < count )
    {
        count = StrSourceLength;
    }

    /* concatenate new string */
    while( *strSource && LoopCount < count )
    {
      *strDest++ = *strSource++;
      LoopCount++;
    }

    /* add terminating null */
    *strDest = '\0';

    LOGEXIT("wcsncat returning char16_t %p (%S)\n", start, start);
    PERF_EXIT(wcsncat);
    return start;
}